

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  bool bVar1;
  iterator __first;
  iterator __last;
  istream *piVar2;
  size_type sVar3;
  ostream *poVar4;
  long lVar5;
  char *local_718;
  eval_error *ee;
  Boxed_Value *e;
  load_module_error *e_1;
  exception *e_2;
  undefined1 local_670 [24];
  string local_658 [32];
  undefined1 local_638 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f8 [8];
  string line;
  _Rb_tree_color local_5d0;
  allocator<char> local_5c9;
  anon_enum_32 mode;
  string arg;
  int i;
  bool any_exception_ok;
  bool boxed_exception_ok;
  bool eval_error_ok;
  _func_double *local_580;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_578;
  allocator<char> local_561;
  string local_560;
  _func_eval_error_function<void_()>_ptr *local_540;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_538;
  allocator<char> local_521;
  string local_520;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
  *local_500;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4f8;
  allocator<char> local_4e1;
  string local_4e0;
  _func_void_int *local_4c0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4b8;
  allocator<char> local_4a1;
  string local_4a0;
  _func_void_int *local_480;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_478;
  allocator<char> local_461;
  string local_460;
  _func_void_int *local_440;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_438;
  vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> local_428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  local_3e0;
  ModulePtr local_3d8;
  undefined1 local_3c8 [8];
  ChaiScript_Basic chai;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  const_iterator local_88;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchpaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  char *modulepath;
  char *usepath;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  usepath = (char *)argv;
  argv_local._0_4_ = argc;
  modulepath = getenv("CHAI_USE_PATH");
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)getenv("CHAI_MODULE_PATH");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40,
             (char (*) [1])0x76ebc5);
  if (modulepath != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40,
               &modulepath);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&searchpaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  default_search_paths_abi_cxx11_();
  this = &searchpaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_88,&local_90);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80);
  chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                         ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                          local_88,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )__first._M_current,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )__last._M_current);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &searchpaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [1])0x76ebc5);
  if (usepaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &searchpaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char **)&usepaths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3f8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&searchpaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_410,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            ((ChaiScript_Basic *)local_3c8,&local_3d8,&local_3e0,&local_3f8,&local_410,&local_428);
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~vector(&local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f8);
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  ::~unique_ptr(&local_3e0);
  std::shared_ptr<chaiscript::Module>::~shared_ptr(&local_3d8);
  local_440 = myexit;
  chaiscript::fun<void(*)(int)>((chaiscript *)&local_438,&local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"exit",&local_461);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_3c8,&local_438,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_438);
  local_480 = myexit;
  chaiscript::fun<void(*)(int)>((chaiscript *)&local_478,&local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"quit",&local_4a1);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_3c8,&local_478,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_478);
  local_4c0 = help;
  chaiscript::fun<void(*)(int)>((chaiscript *)&local_4b8,&local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"help",&local_4e1);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_3c8,&local_4b8,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4b8);
  local_500 = throws_exception_abi_cxx11_;
  chaiscript::fun<std::__cxx11::string(*)(std::function<void()>const&)>
            ((chaiscript *)&local_4f8,&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"throws_exception",&local_521);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_3c8,&local_4f8,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4f8);
  local_540 = get_eval_error;
  chaiscript::fun<chaiscript::exception::eval_error(*)(std::function<void()>const&)>
            ((chaiscript *)&local_538,&local_540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"get_eval_error",&local_561);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_3c8,&local_538,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_538);
  local_580 = now;
  chaiscript::fun<double(*)()>((chaiscript *)&local_578,&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"now",(allocator<char> *)(arg.field_2._M_local_buf + 0xf));
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_3c8,&local_578,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)(arg.field_2._M_local_buf + 0xf));
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_578);
  arg.field_2._M_local_buf[0xe] = '\0';
  arg.field_2._M_local_buf[0xd] = '\0';
  arg.field_2._M_local_buf[0xc] = '\0';
  for (arg.field_2._8_4_ = 0; (int)arg.field_2._8_4_ < (int)argv_local;
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1) {
    if ((arg.field_2._8_4_ == 0) && (1 < (int)argv_local)) {
      arg.field_2._8_4_ = 1;
    }
    if (arg.field_2._8_4_ == 0) {
      local_718 = "--interactive";
    }
    else {
      local_718 = *(char **)(usepath + (long)(int)arg.field_2._8_4_ * 8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&mode,local_718,&local_5c9);
    std::allocator<char>::~allocator(&local_5c9);
    local_5d0 = _S_black;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mode,"-c");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&mode,"--command"), bVar1)) {
      if ((int)argv_local <= arg.field_2._8_4_ + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"insufficient input following ");
        poVar4 = std::operator<<(poVar4,(string *)&mode);
        std::operator<<(poVar4,'\n');
        argv_local._4_4_ = 1;
        line.field_2._12_4_ = 1;
        goto LAB_00564fbb;
      }
      lVar5 = (long)(int)arg.field_2._8_4_;
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mode,
                 *(char **)(usepath + lVar5 * 8 + 8));
LAB_00564aab:
      if (local_5d0 == _S_red) {
        interactive((ChaiScript_Basic *)local_3c8);
      }
      else if (local_5d0 == _S_black) {
        std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr
                  ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)local_638);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_658,"__EVAL__",(allocator<char> *)(local_670 + 0x17));
        chaiscript::ChaiScript_Basic::eval
                  ((ChaiScript_Basic *)(local_638 + 0x10),(string *)local_3c8,
                   (Exception_Handler *)&mode,(string *)local_638);
        chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)(local_638 + 0x10));
        std::__cxx11::string::~string(local_658);
        std::allocator<char>::~allocator((allocator<char> *)(local_670 + 0x17));
        std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr
                  ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)local_638);
      }
      else if (local_5d0 == 2) {
        std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr
                  ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)&e_2);
        chaiscript::ChaiScript_Basic::eval_file
                  ((ChaiScript_Basic *)local_670,(string *)local_3c8,(Exception_Handler *)&mode);
        chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)local_670);
        std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr
                  ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)&e_2);
      }
      line.field_2._12_4_ = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mode,"-");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&mode,"--stdin"), bVar1)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mode,"");
        std::__cxx11::string::string((string *)local_5f8);
        while( true ) {
          piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&std::cin,(string *)local_5f8);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
          if (!bVar1) break;
          std::operator+(&local_618,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5f8,'\n');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mode,
                     &local_618);
          std::__cxx11::string::~string((string *)&local_618);
        }
        std::__cxx11::string::~string((string *)local_5f8);
        goto LAB_00564aab;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mode,"-v");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&mode,"--version"), bVar1)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mode,
                   "print(version())");
        goto LAB_00564aab;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mode,"-h");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&mode,"--help"), bVar1)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mode,
                   "help(-1)");
        goto LAB_00564aab;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &mode,"-e");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&mode,"--evalerrorok"), bVar1)) {
        arg.field_2._M_local_buf[0xe] = '\x01';
        line.field_2._12_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&mode,"--exception");
        if (bVar1) {
          arg.field_2._M_local_buf[0xd] = '\x01';
          line.field_2._12_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&mode,"--any-exception");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&mode,"-i");
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&mode,"--interactive"), bVar1)) {
              local_5d0 = _S_red;
            }
            else {
              sVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&mode,'-',0);
              if (sVar3 == 0) {
                poVar4 = std::operator<<((ostream *)&std::cout,"unrecognised argument ");
                poVar4 = std::operator<<(poVar4,(string *)&mode);
                std::operator<<(poVar4,'\n');
                argv_local._4_4_ = 1;
                line.field_2._12_4_ = 1;
                goto LAB_00564fbb;
              }
              local_5d0 = 2;
            }
            goto LAB_00564aab;
          }
          arg.field_2._M_local_buf[0xc] = '\x01';
          line.field_2._12_4_ = 4;
        }
      }
    }
LAB_00564fbb:
    std::__cxx11::string::~string((string *)&mode);
    if ((line.field_2._12_4_ != 0) && (line.field_2._12_4_ != 4)) goto LAB_00565024;
  }
  argv_local._4_4_ = 0;
  line.field_2._12_4_ = 1;
LAB_00565024:
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic((ChaiScript_Basic *)local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&searchpaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath != nullptr) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;
  std::vector<std::string> searchpaths = default_search_paths();
  modulepaths.insert(modulepaths.end(), searchpaths.begin(), searchpaths.end());
  modulepaths.emplace_back("");
  if (modulepath != nullptr) {
    modulepaths.emplace_back(modulepath);
  }

  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser(), modulepaths, usepaths);

  chai.add(chaiscript::fun(&myexit), "exit");
  chai.add(chaiscript::fun(&myexit), "quit");
  chai.add(chaiscript::fun(&help), "help");
  chai.add(chaiscript::fun(&throws_exception), "throws_exception");
  chai.add(chaiscript::fun(&get_eval_error), "get_eval_error");
  chai.add(chaiscript::fun(&now), "now");

  bool eval_error_ok = false;
  bool boxed_exception_ok = false;
  bool any_exception_ok = false;

  for (int i = 0; i < argc; ++i) {
    if (i == 0 && argc > 1) {
      ++i;
    }

    std::string arg(i != 0 ? argv[i] : "--interactive");

    enum {
      eInteractive,
      eCommand,
      eFile
    } mode
        = eCommand;

    if (arg == "-c" || arg == "--command") {
      if ((i + 1) >= argc) {
        std::cout << "insufficient input following " << arg << '\n';
        return EXIT_FAILURE;
      }
      arg = argv[++i];

    } else if (arg == "-" || arg == "--stdin") {
      arg = "";
      std::string line;
      while (std::getline(std::cin, line)) {
        arg += line + '\n';
      }
    } else if (arg == "-v" || arg == "--version") {
      arg = "print(version())";
    } else if (arg == "-h" || arg == "--help") {
      arg = "help(-1)";
    } else if (arg == "-e" || arg == "--evalerrorok") {
      eval_error_ok = true;
      continue;
    } else if (arg == "--exception") {
      boxed_exception_ok = true;
      continue;
    } else if (arg == "--any-exception") {
      any_exception_ok = true;
      continue;
    } else if (arg == "-i" || arg == "--interactive") {
      mode = eInteractive;
    } else if (arg.find('-') == 0) {
      std::cout << "unrecognised argument " << arg << '\n';
      return EXIT_FAILURE;
    } else {
      mode = eFile;
    }

    try {
      switch (mode) {
        case eInteractive:
          interactive(chai);
          break;
        case eCommand:
          chai.eval(arg);
          break;
        case eFile:
          chai.eval_file(arg);
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.pretty_print();
      std::cout << '\n';

      if (!eval_error_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::Boxed_Value &e) {
      std::cout << "Unhandled exception thrown of type " << e.get_type_info().name() << '\n';

      if (!boxed_exception_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::exception::load_module_error &e) {
      std::cout << "Unhandled module load error\n"
                << e.what() << '\n';
    } catch (std::exception &e) {
      std::cout << "Unhandled standard exception: " << e.what() << '\n';
      if (!any_exception_ok) {
        throw;
      }
    } catch (...) {
      std::cout << "Unhandled unknown exception" << '\n';
      if (!any_exception_ok) {
        throw;
      }
    }
  }

  return EXIT_SUCCESS;
}